

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextdocument.cpp
# Opt level: O1

void QTextDocument::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  byte *pbVar2;
  PrivateShared *pPVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  QArrayData *pQVar8;
  QFont *font;
  byte bVar9;
  QAbstractTextDocumentLayout *pQVar10;
  anon_union_24_3_e3d07ef4_for_data *paVar11;
  int iVar12;
  bool undo;
  undefined1 uVar13;
  QTextDocumentPrivate *pQVar14;
  long in_FS_OFFSET;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 in_XMM1_Qa;
  undefined4 local_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    contentsChange((QTextDocument *)_o,*_a[1],*_a[2],*_a[3]);
    break;
  case 1:
    iVar12 = 1;
    goto LAB_004d5519;
  case 2:
    undoAvailable((QTextDocument *)_o,*_a[1]);
    break;
  case 3:
    redoAvailable((QTextDocument *)_o,*_a[1]);
    break;
  case 4:
    iVar12 = 4;
    goto LAB_004d5519;
  case 5:
    modificationChanged((QTextDocument *)_o,*_a[1]);
    break;
  case 6:
    local_58._8_8_ = _a[1];
    paVar11 = &local_58;
    local_58.shared = (PrivateShared *)0x0;
    iVar12 = 6;
    goto LAB_004d55b2;
  case 7:
    local_5c = *_a[1];
    local_58._8_8_ = &local_5c;
    paVar11 = &local_58;
    local_58.shared = (PrivateShared *)0x0;
    iVar12 = 7;
    goto LAB_004d55b2;
  case 8:
    local_58._8_8_ = _a[1];
    paVar11 = &local_58;
    local_58.shared = (PrivateShared *)0x0;
    iVar12 = 8;
    goto LAB_004d55b2;
  case 9:
    iVar12 = 9;
LAB_004d5519:
    paVar11 = (anon_union_24_3_e3d07ef4_for_data *)0x0;
LAB_004d55b2:
    QMetaObject::activate(_o,&staticMetaObject,iVar12,&paVar11->shared);
    break;
  case 10:
    pQVar14 = *(QTextDocumentPrivate **)(_o + 8);
    undo = true;
    goto LAB_004d557e;
  case 0xb:
    pQVar14 = *(QTextDocumentPrivate **)(_o + 8);
    undo = false;
LAB_004d557e:
    QTextDocumentPrivate::undoRedo(pQVar14,undo);
    break;
  case 0xc:
    QTextDocumentPrivate::appendUndoItem(*(QTextDocumentPrivate **)(_o + 8),*_a[1]);
    break;
  case 0xd:
    uVar13 = *_a[1];
    pQVar14 = *(QTextDocumentPrivate **)(_o + 8);
    goto LAB_004d553f;
  case 0xe:
    pQVar14 = *(QTextDocumentPrivate **)(_o + 8);
    uVar13 = true;
LAB_004d553f:
    QTextDocumentPrivate::setModified(pQVar14,(bool)uVar13);
    break;
  case 0xf:
    local_58._16_4_ = 0xaaaaaaaa;
    local_58._20_4_ = 0xaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)_o + 0x70))(&local_58,_o,*_a[1],_a[2]);
    if ((QVariant *)*_a != (QVariant *)0x0) {
      ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_58);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_004d53cc_caseD_3;
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == contentsChange) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_004d53cc_caseD_3;
      }
      if (((code *)*plVar1 == contentsChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_004d53cc_caseD_3;
      }
      if (((code *)*plVar1 == undoAvailable) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_004d53cc_caseD_3;
      }
      if (((code *)*plVar1 == redoAvailable) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 3;
        goto switchD_004d53cc_caseD_3;
      }
      if (((code *)*plVar1 == undoCommandAdded) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 4;
        goto switchD_004d53cc_caseD_3;
      }
      if (((code *)*plVar1 == modificationChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 5;
        goto switchD_004d53cc_caseD_3;
      }
      if (((code *)*plVar1 == cursorPositionChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 6;
        goto switchD_004d53cc_caseD_3;
      }
      if (((code *)*plVar1 == blockCountChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 7;
        goto switchD_004d53cc_caseD_3;
      }
      if (((code *)*plVar1 == baseUrlChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 8;
        goto switchD_004d53cc_caseD_3;
      }
      if (((code *)*plVar1 == documentLayoutChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 9;
        goto switchD_004d53cc_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_004d53cc_caseD_3;
        goto switchD_004d53cc_caseD_1;
      }
    }
    goto switchD_004d53cc_caseD_2;
  }
switchD_004d53cc_caseD_1:
  if (0xd < (uint)_id) goto LAB_004d58e5;
  pbVar2 = (byte *)*_a;
  switch(_id) {
  case 0:
    bVar9 = *(byte *)(*(long *)(_o + 8) + 0xb8);
    goto LAB_004d582f;
  case 1:
    bVar9 = *(byte *)(*(long *)(_o + 8) + 200);
    goto LAB_004d582f;
  case 2:
    uVar6 = *(undefined8 *)(*(long *)(_o + 8) + 0x2a0);
    *(undefined8 *)pbVar2 = *(undefined8 *)(*(long *)(_o + 8) + 0x298);
    *(undefined8 *)(pbVar2 + 8) = uVar6;
    break;
  case 3:
    QFont::QFont((QFont *)&local_58,(QFont *)(*(long *)(_o + 8) + 0x128));
    pPVar3 = *(PrivateShared **)pbVar2;
    *(PrivateShared **)pbVar2 = local_58.shared;
    uVar15 = *(undefined4 *)(pbVar2 + 8);
    *(undefined4 *)(pbVar2 + 8) = local_58._8_4_;
    local_58._8_4_ = uVar15;
    local_58.shared = pPVar3;
    QFont::~QFont((QFont *)&local_58);
    break;
  case 4:
    *pbVar2 = (byte)(*(uint *)(*(long *)(_o + 8) + 0x1d0) >> 0xd) & 1;
    break;
  case 5:
    bVar9 = *(byte *)(*(long *)(_o + 8) + 0x1cd);
LAB_004d582f:
    *pbVar2 = bVar9;
    break;
  case 6:
    pQVar10 = documentLayout((QTextDocument *)_o);
    uVar6 = (**(code **)(*(long *)pQVar10 + 0x78))(pQVar10);
    *(undefined8 *)pbVar2 = uVar6;
    *(undefined8 *)(pbVar2 + 8) = in_XMM1_Qa;
    break;
  case 7:
    uVar15 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0x298);
    uVar16 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0x298) >> 0x20);
    goto LAB_004d580e;
  case 8:
    uVar15 = *(undefined4 *)(*(long *)(*(long *)(_o + 8) + 0x160) + 0xc);
    goto LAB_004d58e1;
  case 9:
    uVar15 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0x308);
    uVar16 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0x308) >> 0x20);
    goto LAB_004d580e;
  case 10:
    lVar4 = *(long *)(_o + 8);
    piVar5 = *(int **)(lVar4 + 0x1b0);
    uVar6 = *(undefined8 *)(lVar4 + 0x1b8);
    uVar7 = *(undefined8 *)(lVar4 + 0x1c0);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    pQVar8 = *(QArrayData **)pbVar2;
    *(int **)pbVar2 = piVar5;
    *(undefined8 *)(pbVar2 + 8) = uVar6;
    *(undefined8 *)(pbVar2 + 0x10) = uVar7;
    if (pQVar8 != (QArrayData *)0x0) {
      LOCK();
      (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar8,2,0x10);
      }
    }
    break;
  case 0xb:
    uVar15 = *(undefined4 *)(*(long *)(_o + 8) + 0x290);
LAB_004d58e1:
    *(undefined4 *)pbVar2 = uVar15;
    break;
  case 0xc:
    uVar15 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0x310);
    uVar16 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0x310) >> 0x20);
LAB_004d580e:
    *(ulong *)pbVar2 = CONCAT44(uVar16,uVar15);
    break;
  case 0xd:
    QUrl::QUrl((QUrl *)&local_58.shared,(QUrl *)(*(long *)(_o + 8) + 0x318));
    pPVar3 = *(PrivateShared **)pbVar2;
    *(PrivateShared **)pbVar2 = local_58.shared;
    local_58.shared = pPVar3;
    QUrl::~QUrl((QUrl *)&local_58.shared);
  }
LAB_004d58e5:
  if (_c != WriteProperty) goto switchD_004d53cc_caseD_3;
switchD_004d53cc_caseD_2:
  if (0xd < (uint)_id) goto switchD_004d53cc_caseD_3;
  font = (QFont *)*_a;
  switch(_id) {
  case 0:
    uVar13 = *(undefined1 *)&(font->d).d.ptr;
    pQVar14 = *(QTextDocumentPrivate **)(_o + 8);
    goto LAB_004d59a4;
  case 1:
    QTextDocumentPrivate::setModified(*(QTextDocumentPrivate **)(_o + 8),*(bool *)&(font->d).d.ptr);
    break;
  case 2:
    setPageSize((QTextDocument *)_o,(QSizeF *)font);
    break;
  case 3:
    setDefaultFont((QTextDocument *)_o,font);
    break;
  case 4:
    setUseDesignMetrics((QTextDocument *)_o,*(bool *)&(font->d).d.ptr);
    break;
  case 5:
    setLayoutEnabled((QTextDocument *)_o,*(bool *)&(font->d).d.ptr);
    break;
  case 7:
    setTextWidth((QTextDocument *)_o,(qreal)(font->d).d.ptr);
    break;
  case 9:
    setIndentWidth((QTextDocument *)_o,(qreal)(font->d).d.ptr);
    break;
  case 10:
    setDefaultStyleSheet((QTextDocument *)_o,(QString *)font);
    break;
  case 0xb:
    pQVar14 = *(QTextDocumentPrivate **)(_o + 8);
    pQVar14->maximumBlockCount = *(int *)&(font->d).d.ptr;
    QTextDocumentPrivate::ensureMaximumBlockCount(pQVar14);
    pQVar14 = *(QTextDocumentPrivate **)(_o + 8);
    uVar13 = false;
LAB_004d59a4:
    QTextDocumentPrivate::enableUndoRedo(pQVar14,(bool)uVar13);
    break;
  case 0xc:
    setDocumentMargin((QTextDocument *)_o,(qreal)(font->d).d.ptr);
    break;
  case 0xd:
    setBaseUrl((QTextDocument *)_o,(QUrl *)font);
  }
switchD_004d53cc_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTextDocument *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->contentsChange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 1: _t->contentsChanged(); break;
        case 2: _t->undoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->redoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->undoCommandAdded(); break;
        case 5: _t->modificationChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 6: _t->cursorPositionChanged((*reinterpret_cast< std::add_pointer_t<QTextCursor>>(_a[1]))); break;
        case 7: _t->blockCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->baseUrlChanged((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 9: _t->documentLayoutChanged(); break;
        case 10: _t->undo(); break;
        case 11: _t->redo(); break;
        case 12: _t->appendUndoItem((*reinterpret_cast< std::add_pointer_t<QAbstractUndoItem*>>(_a[1]))); break;
        case 13: _t->setModified((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 14: _t->setModified(); break;
        case 15: { QVariant _r = _t->loadResource((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(int , int , int )>(_a, &QTextDocument::contentsChange, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)()>(_a, &QTextDocument::contentsChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(bool )>(_a, &QTextDocument::undoAvailable, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(bool )>(_a, &QTextDocument::redoAvailable, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)()>(_a, &QTextDocument::undoCommandAdded, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(bool )>(_a, &QTextDocument::modificationChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(const QTextCursor & )>(_a, &QTextDocument::cursorPositionChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(int )>(_a, &QTextDocument::blockCountChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(const QUrl & )>(_a, &QTextDocument::baseUrlChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)()>(_a, &QTextDocument::documentLayoutChanged, 9))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isUndoRedoEnabled(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isModified(); break;
        case 2: *reinterpret_cast<QSizeF*>(_v) = _t->pageSize(); break;
        case 3: *reinterpret_cast<QFont*>(_v) = _t->defaultFont(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->useDesignMetrics(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isLayoutEnabled(); break;
        case 6: *reinterpret_cast<QSizeF*>(_v) = _t->size(); break;
        case 7: *reinterpret_cast<qreal*>(_v) = _t->textWidth(); break;
        case 8: *reinterpret_cast<int*>(_v) = _t->blockCount(); break;
        case 9: *reinterpret_cast<qreal*>(_v) = _t->indentWidth(); break;
        case 10: *reinterpret_cast<QString*>(_v) = _t->defaultStyleSheet(); break;
        case 11: *reinterpret_cast<int*>(_v) = _t->maximumBlockCount(); break;
        case 12: *reinterpret_cast<qreal*>(_v) = _t->documentMargin(); break;
        case 13: *reinterpret_cast<QUrl*>(_v) = _t->baseUrl(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setUndoRedoEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setModified(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setPageSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 3: _t->setDefaultFont(*reinterpret_cast<QFont*>(_v)); break;
        case 4: _t->setUseDesignMetrics(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setLayoutEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setTextWidth(*reinterpret_cast<qreal*>(_v)); break;
        case 9: _t->setIndentWidth(*reinterpret_cast<qreal*>(_v)); break;
        case 10: _t->setDefaultStyleSheet(*reinterpret_cast<QString*>(_v)); break;
        case 11: _t->setMaximumBlockCount(*reinterpret_cast<int*>(_v)); break;
        case 12: _t->setDocumentMargin(*reinterpret_cast<qreal*>(_v)); break;
        case 13: _t->setBaseUrl(*reinterpret_cast<QUrl*>(_v)); break;
        default: break;
        }
    }
}